

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

int Abc_WinNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t **ppAVar5;
  Aig_Man_t *pAVar6;
  Cnf_Dat_t *pCVar7;
  sat_solver *psVar8;
  bool bVar9;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  pVVar4 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar4;
  pAVar1 = p->pNtk;
  ppAVar5 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar4 = Abc_NtkNodeSupport(pAVar1,ppAVar5,iVar2);
  p->vSupp = pVVar4;
  pAVar1 = p->pNtk;
  ppAVar5 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar4 = Abc_NtkDfsNodes(pAVar1,ppAVar5,iVar2);
  p->vNodes = pVVar4;
  if ((p->pPars->nWinMax != 0) && (iVar2 = Vec_PtrSize(p->vNodes), p->pPars->nWinMax < iVar2)) {
    return 1;
  }
  iVar2 = Abc_ObjRequiredLevel(pNode);
  pVVar4 = Abc_MfsComputeDivisors(p,pNode,iVar2 + -1);
  p->vDivs = pVVar4;
  iVar2 = Vec_PtrSize(p->vDivs);
  iVar3 = Abc_ObjFaninNum(pNode);
  p->nTotalDivs = (iVar2 - iVar3) + p->nTotalDivs;
  pAVar6 = Abc_NtkConstructAig(p,pNode);
  p->pAigWin = pAVar6;
  pAVar6 = p->pAigWin;
  iVar2 = Vec_PtrSize(p->vDivs);
  pCVar7 = Cnf_DeriveSimple(pAVar6,iVar2 + 1);
  p->pCnf = pCVar7;
  psVar8 = Abc_MfsCreateSolverResub(p,(int *)0x0,0,0);
  p->pSat = psVar8;
  bVar9 = p->pSat == (sat_solver *)0x0;
  if (bVar9) {
    p->nNodesBad = p->nNodesBad + 1;
  }
  p_local._4_4_ = (uint)bVar9;
  return p_local._4_4_;
}

Assistant:

int Abc_WinNode(Mfs_Man_t * p, Abc_Obj_t *pNode)
{
//    abctime clk;
//    Abc_Obj_t * pFanin;
//    int i;

    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    if ( p->pPars->nWinMax && Vec_PtrSize(p->vNodes) > p->pPars->nWinMax )
        return 1;
    // compute the divisors of the window
    p->vDivs  = Abc_MfsComputeDivisors( p, pNode, Abc_ObjRequiredLevel(pNode) - 1 );
    p->nTotalDivs += Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode);
    // construct AIG for the window
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
    // translate it into CNF
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, 1 + Vec_PtrSize(p->vDivs) );
    // create the SAT problem
    p->pSat = Abc_MfsCreateSolverResub( p, NULL, 0, 0 );
    if ( p->pSat == NULL )
    {
        p->nNodesBad++;
        return 1;
    }
    return 0;
}